

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O2

void __thiscall
t_haxe_generator::generate_haxe_doc(t_haxe_generator *this,ostream *out,t_function *tfunction)

{
  t_struct *ptVar1;
  t_field *ptVar2;
  ostream *poVar3;
  pointer pptVar4;
  stringstream ss;
  allocator local_24b;
  allocator local_24a;
  allocator local_249;
  t_haxe_generator *local_248;
  ostream *local_240;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  if ((tfunction->super_t_doc).has_doc_ == true) {
    local_248 = this;
    local_240 = out;
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::operator<<(&local_1a8,(string *)&(tfunction->super_t_doc).doc_);
    ptVar1 = tfunction->arglist_;
    for (pptVar4 = (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar4 !=
        (ptVar1->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
      ptVar2 = *pptVar4;
      poVar3 = std::operator<<(&local_1a8,"\n@param ");
      std::operator<<(poVar3,(string *)&ptVar2->name_);
      if ((ptVar2->super_t_doc).has_doc_ == true) {
        poVar3 = std::operator<<(&local_1a8," ");
        std::operator<<(poVar3,(string *)&(ptVar2->super_t_doc).doc_);
      }
    }
    std::__cxx11::string::string((string *)&local_1d8,"/**\n",&local_249);
    std::__cxx11::string::string((string *)&local_1f8," * ",&local_24a);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::string((string *)&local_238," */\n",&local_24b);
    t_generator::generate_docstring_comment
              ((t_generator *)local_248,local_240,&local_1d8,&local_1f8,&local_218,&local_238);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  return;
}

Assistant:

void t_haxe_generator::generate_haxe_doc(ostream& out, t_function* tfunction) {
  if (tfunction->has_doc()) {
    stringstream ss;
    ss << tfunction->get_doc();
    const vector<t_field*>& fields = tfunction->get_arglist()->get_members();
    vector<t_field*>::const_iterator p_iter;
    for (p_iter = fields.begin(); p_iter != fields.end(); ++p_iter) {
      t_field* p = *p_iter;
      ss << "\n@param " << p->get_name();
      if (p->has_doc()) {
        ss << " " << p->get_doc();
      }
    }
    generate_docstring_comment(out, "/**\n", " * ", ss.str(), " */\n");
  }
}